

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::addKernelInfo(CLIntercept *this,cl_kernel kernel,cl_kernel source_kernel)

{
  mapped_type *pmVar1;
  mapped_type *this_00;
  cl_kernel local_28;
  cl_kernel local_20;
  
  local_28 = kernel;
  local_20 = source_kernel;
  std::mutex::lock(&this->m_Mutex);
  pmVar1 = std::
           map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
           ::operator[](&this->m_KernelInfoMap,&local_20);
  this_00 = std::
            map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
            ::operator[](&this->m_KernelInfoMap,&local_28);
  SKernelInfo::operator=(this_00,pmVar1);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::addKernelInfo(
    const cl_kernel kernel,
    const cl_kernel source_kernel )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    m_KernelInfoMap[ kernel ] = m_KernelInfoMap[ source_kernel ];
}